

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileInstaller::CheckValue(cmFileInstaller *this,string *arg)

{
  int iVar1;
  bool bVar2;
  string *arg_local;
  cmFileInstaller *this_local;
  
  iVar1 = (this->super_cmFileCopier).Doing;
  if (iVar1 == 9) {
    bVar2 = GetTargetTypeFromString(this,arg);
    if (!bVar2) {
      (this->super_cmFileCopier).Doing = 1;
    }
  }
  else {
    if (iVar1 != 10) {
      bVar2 = cmFileCopier::CheckValue(&this->super_cmFileCopier,arg);
      return bVar2;
    }
    std::__cxx11::string::operator=((string *)&this->Rename,(string *)arg);
  }
  return true;
}

Assistant:

bool cmFileInstaller::CheckValue(std::string const& arg)
{
  switch(this->Doing)
    {
    case DoingType:
      if(!this->GetTargetTypeFromString(arg))
        {
        this->Doing = DoingError;
        }
      break;
    case DoingRename:
      this->Rename = arg;
      break;
    default:
      return this->cmFileCopier::CheckValue(arg);
    }
  return true;
}